

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O1

optional<n_e_s::core::Pixel> __thiscall n_e_s::nes::Nes::execute(Nes *this)

{
  uint64_t uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar4;
  ulong uVar5;
  
  uVar1 = this->cycle_;
  this->cycle_ = uVar1 + 1;
  uVar5 = uVar1 * -0x5555555555555555;
  uVar3 = 0x1555555555555555;
  if ((uVar5 >> 2 | uVar5 << 0x3e) < 0x1555555555555556) {
    iVar2 = (*(((this->cpu_)._M_t.
                super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
                ._M_t.
                super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
                .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu).
              _vptr_ICpu[2])();
    uVar3 = CONCAT44(extraout_var,iVar2);
  }
  if ((this->cycle_ & 3) == 0) {
    iVar2 = (*((this->ppu_)._M_t.
               super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>.
               _M_t.
               super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
               super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    uVar3 = CONCAT44(extraout_var_00,iVar2);
    bVar4 = (byte)((uint)extraout_var_00 >> 8);
  }
  else {
    bVar4 = 0;
  }
  return (_Optional_base<n_e_s::core::Pixel,_true,_true>)
         ((uint6)uVar3 & 0xffffffffff | (uint6)bVar4 << 0x28);
}

Assistant:

std::optional<core::Pixel> Nes::execute() {
    if (cycle_++ % 12 == 0) {
        cpu_->execute();
    }

    if (cycle_ % 4 == 0) {
        return ppu_->execute();
    }

    // The APU runs at master clock % 24. (every other CPU tick)
    return {};
}